

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O2

bool __thiscall Jinx::Variant::ConvertTo(Variant *this,ValueType type)

{
  ValueType valueType;
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  Guid *in_RDX;
  undefined4 in_register_00000034;
  ulong value;
  double dVar5;
  double number;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [3];
  Allocator<char> local_21;
  
  valueType = this->m_type;
  bVar2 = true;
  if (valueType == type) {
    return true;
  }
  if (type == Null) goto LAB_0011247d;
  switch(valueType) {
  case Null:
    switch(type) {
    case Number:
switchD_001122eb_caseD_1:
      dVar5 = 0.0;
LAB_0011261e:
      SetNumber(this,dVar5);
      return bVar2;
    case Integer:
      value = 0;
LAB_001125b6:
      SetInteger(this,value);
      return bVar2;
    case Boolean:
      number._0_1_ = false;
      goto LAB_00112527;
    case String:
      Impl::NullToString_abi_cxx11_();
      SetString(this,(String *)&number);
LAB_00112547:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&number);
      return true;
    }
    break;
  case Number:
    if (type == String) {
      Impl::NumberToString_abi_cxx11_
                ((String *)&number,(Impl *)CONCAT44(in_register_00000034,type),
                 (this->field_1).m_number);
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
    if (type == Boolean) {
      number._0_1_ = -((this->field_1).m_number != 0.0) & 1;
      goto LAB_00112527;
    }
    if (type == Integer) {
      value = (ulong)(this->field_1).m_number;
      goto LAB_001125b6;
    }
    break;
  case Integer:
    if (type == String) {
      Impl::IntegerToString_abi_cxx11_
                ((String *)&number,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(int64_t)in_RDX);
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
    if (type == Boolean) {
      sVar1 = (this->field_1).m_integer;
      goto LAB_0011249a;
    }
    if (type == Number) {
      dVar5 = (double)(this->field_1).m_integer;
      goto LAB_0011261e;
    }
    break;
  case Boolean:
    if (type == String) {
      Impl::BooleanToString_abi_cxx11_
                ((String *)&number,(Impl *)(ulong)(this->field_1).m_boolean,SUB81(in_RDX,0));
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
    if (type == Integer) {
      value = (ulong)(this->field_1).m_boolean;
      goto LAB_001125b6;
    }
    if (type == Number) {
      if ((this->field_1).m_boolean != false) {
        dVar5 = 1.0;
        goto LAB_0011261e;
      }
      goto switchD_001122eb_caseD_1;
    }
    break;
  case String:
    switch(type) {
    case Number:
      bVar2 = Impl::StringToNumber(&(this->field_1).m_string,&number,International);
      if (bVar2) {
        dVar5 = (double)CONCAT44(number._4_4_,number._0_4_);
        goto LAB_0011261e;
      }
      dVar5 = (this->field_1).m_number;
      pcVar3 = "Error converting string %s to number";
      break;
    case Integer:
      bVar2 = Impl::StringToInteger(&(this->field_1).m_string,(int64_t *)&number);
      if (bVar2) {
        value = CONCAT44(number._4_4_,number._0_4_);
        goto LAB_001125b6;
      }
      dVar5 = (this->field_1).m_number;
      pcVar3 = "Error converting string %s to integer";
      break;
    case Boolean:
      bVar2 = Impl::StringToBoolean(&(this->field_1).m_string,(bool *)&number);
      if (bVar2) {
        goto LAB_00112527;
      }
      dVar5 = (this->field_1).m_number;
      pcVar3 = "Error converting string %s to boolean";
      break;
    default:
      goto switchD_001122ce_caseD_6;
    case Collection:
      CreateCollection();
      bVar2 = Impl::StringToCollection(&(this->field_1).m_string,(CollectionPtr *)&number);
      if (bVar2) {
        SetCollection(this,(CollectionPtr *)&number);
      }
      else {
        Impl::LogWriteLine(Error,"Error converting string to collection type",
                           (this->field_1).m_collection.
                           super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        SetNull(this);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
      return bVar2;
    case Guid:
      bVar2 = Impl::StringToGuid(&(this->field_1).m_string,(Guid *)&number);
      if (bVar2) {
        SetGuid(this,(Guid *)&number);
        return bVar2;
      }
      dVar5 = (this->field_1).m_number;
      pcVar3 = "Error converting string %s to Guid";
      break;
    case ValType:
      bVar2 = Impl::StringToValueType(&(this->field_1).m_string,(ValueType *)&number);
      if (bVar2) {
        SetValType(this,number._0_4_);
        return bVar2;
      }
      dVar5 = (this->field_1).m_number;
      pcVar3 = "Error converting string %s to value type";
    }
    Impl::LogWriteLine(Error,pcVar3,dVar5);
    goto LAB_0011247d;
  case Collection:
    if (type == Boolean) {
      sVar1 = (((this->field_1).m_collection.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
LAB_0011249a:
      number._0_1_ = sVar1 != 0;
LAB_00112527:
      SetBoolean(this,(bool)number._0_1_);
      return bVar2;
    }
    break;
  case Function:
    if (type == String) {
      Impl::UnsignedIntegerToString_abi_cxx11_
                ((String *)&number,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(uint64_t)in_RDX);
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
    break;
  case Guid:
    if (type == String) {
      Impl::GuidToString_abi_cxx11_((String *)&number,(Impl *)&(this->field_1).m_string,in_RDX);
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
    break;
  case ValType:
    if (type == String) {
      pcVar3 = Impl::GetValueTypeName((this->field_1).m_valType);
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      basic_string<Jinx::Allocator<char>>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&number,pcVar3,
                 &local_21);
      SetString(this,(String *)&number);
      goto LAB_00112547;
    }
  }
switchD_001122ce_caseD_6:
  pcVar3 = Impl::GetValueTypeName(valueType);
  pcVar4 = Impl::GetValueTypeName(type);
  bVar2 = false;
  Impl::LogWriteLine(Error,"Error converting %s to %s",pcVar3,pcVar4);
LAB_0011247d:
  SetNull(this);
  return bVar2;
}

Assistant:

inline_t bool Variant::ConvertTo(ValueType type)
	{
		if (m_type == type)
			return true;
		if (type == ValueType::Null)
		{
			SetNull();
			return true;
		}

		switch (m_type)
		{
			case ValueType::Null:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::NullToNumber());
						return true;
					case ValueType::Integer:
						SetInteger(Impl::NullToInteger());
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NullToBoolean());
						return true;
					case ValueType::String:
						SetString(Impl::NullToString());
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Number:
			{
				switch (type)
				{
					case ValueType::Integer:
						SetInteger(Impl::NumberToInteger(m_number));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NumberToBoolean(m_number));
						return true;
					case ValueType::String:
						SetString(Impl::NumberToString(m_number));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Integer:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::IntegerToNumber(m_integer));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::IntegerToBoolean(m_integer));
						return true;
					case ValueType::String:
						SetString(Impl::IntegerToString(m_integer));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Boolean:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::BooleanToNumber(m_boolean));
						return true;
					case ValueType::Integer:
						SetInteger(Impl::BooleanToInteger(m_boolean));
						return true;
					case ValueType::String:
						SetString(Impl::BooleanToString(m_boolean));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::String:
			{
				switch (type)
				{
					case ValueType::Number:
					{
						double number;
						if (!Impl::StringToNumber(m_string, &number))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to number", m_string.c_str());
							SetNull();
							return false;
						}
						SetNumber(number);
						return true;
					}
					case ValueType::Integer:
					{
						int64_t integer;
						if (!Impl::StringToInteger(m_string, &integer))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to integer", m_string.c_str());
							SetNull();
							return false;
						}
						SetInteger(integer);
						return true;
					}
					case ValueType::Boolean:
					{
						bool boolean;
						if (!Impl::StringToBoolean(m_string, &boolean))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to boolean", m_string.c_str());
							SetNull();
							return false;
						}
						SetBoolean(boolean);
						return true;
					}
					case ValueType::Collection:
					{
						auto collection = CreateCollection();
						if (!Impl::StringToCollection(m_string, &collection))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string to collection type", m_string.c_str());
							SetNull();
							return false;
						}
						SetCollection(collection);
						return true;
					}
					case ValueType::Guid:
					{
						Guid guid;
						if (!Impl::StringToGuid(m_string, &guid))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to Guid", m_string.c_str());
							SetNull();
							return false;
						}
						SetGuid(guid);
						return true;
					}
					case ValueType::ValType:
					{
						ValueType valType;
						if (!Impl::StringToValueType(m_string, &valType))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to value type", m_string.c_str());
							SetNull();
							return false;
						}
						SetValType(valType);
						return true;
					}
					default:
						break;
				};
			}
			break;
			case ValueType::Function:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::UnsignedIntegerToString(m_function));
						return true;
					default:
						break;
				};
				break;
			case ValueType::Collection:
				switch (type)
				{
					case ValueType::Boolean:
						SetBoolean(!m_collection->empty());
						return true;
					default:
						break;
				};
				break;
			case ValueType::Guid:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GuidToString(m_guid));
						return true;
					default:
						break;
				};
				break;
			case ValueType::ValType:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GetValueTypeName(m_valType));
						return true;
					default:
						break;
				};
				break;
			default:
				break;
		};
		Impl::LogWriteLine(LogLevel::Error, "Error converting %s to %s", Impl::GetValueTypeName(m_type), Impl::GetValueTypeName(type));
		SetNull();
		return false;
	}